

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O3

int run_test_pipe_getsockname_blocking(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  bool bVar3;
  uv_pipe_t *puVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_20 [16];
  uv_loop_t *local_10;
  
  auStack_20._0_8_ = (void *)0x1aef2a;
  puVar2 = uv_default_loop();
  auStack_20._0_8_ = (void *)0x1aef3e;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  auStack_20._0_8_ = (void *)0x1aef48;
  uv_run(puVar2,UV_RUN_DEFAULT);
  local_10 = (uv_loop_t *)0x0;
  auStack_20._0_8_ = (void *)0x1aef56;
  puVar2 = uv_default_loop();
  auStack_20._0_8_ = (void *)0x1aef5e;
  iVar1 = uv_loop_close(puVar2);
  auStack_20._8_8_ = SEXT48(iVar1);
  if (local_10 == (uv_loop_t *)auStack_20._8_8_) {
    auStack_20._0_8_ = (void *)0x1aef74;
    uv_library_shutdown();
    return 0;
  }
  puVar4 = (uv_pipe_t *)&stack0xfffffffffffffff0;
  auStack_20._0_8_ = pipe_close_cb;
  run_test_pipe_getsockname_blocking_cold_1();
  bVar3 = puVar4 == &pipe_server || puVar4 == &pipe_client;
  auStack_20._0_8_ = ZEXT18(bVar3);
  if ((void *)auStack_20._0_8_ != (void *)0x0) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)bVar3;
  }
  handle = (uv_handle_t *)auStack_20;
  pipe_close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_getsockname_blocking) {
#ifdef _WIN32
  HANDLE readh, writeh;
  char buf1[1024], buf2[1024];
  size_t len1, len2;
  int r;

  r = CreatePipe(&readh, &writeh, NULL, 65536);
  ASSERT(r);

  r = uv_pipe_init(uv_default_loop(), &pipe_client, 0);
  ASSERT_OK(r);
  r = uv_pipe_open(&pipe_client, readh);
  ASSERT_OK(r);
  r = uv_read_start((uv_stream_t*) &pipe_client,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_OK(r);
  Sleep(100);
  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT_OK(r);

  len1 = sizeof buf1;
  r = uv_pipe_getsockname(&pipe_client, buf1, &len1);
  ASSERT_OK(r);
  ASSERT_OK(len1);  /* It's an annonymous pipe. */

  r = uv_read_start((uv_stream_t*)&pipe_client,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_OK(r);
  Sleep(100);

  len2 = sizeof buf2;
  r = uv_pipe_getsockname(&pipe_client, buf2, &len2);
  ASSERT_OK(r);
  ASSERT_OK(len2);  /* It's an annonymous pipe. */

  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT_OK(r);

  ASSERT_EQ(len1, len2);
  ASSERT_OK(memcmp(buf1, buf2, len1));

  pipe_close_cb_called = 0;
  uv_close((uv_handle_t*)&pipe_client, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, pipe_close_cb_called);

  CloseHandle(writeh);
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}